

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_vote.cxx
# Opt level: O3

void __thiscall nuraft::raft_server::request_prevote(raft_server *this)

{
  atomic<int> *paVar1;
  uint uVar2;
  srv_role sVar3;
  int32 iVar4;
  element_type *peVar5;
  __int_type _Var6;
  _func_int **pp_Var7;
  element_type *peVar8;
  bool bVar9;
  int iVar10;
  int32 iVar11;
  int iVar12;
  uint64_t uVar13;
  undefined1 *puVar14;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar15;
  undefined4 extraout_var_01;
  _func_int **pp_Var16;
  undefined4 extraout_var_02;
  int iVar17;
  long lVar18;
  _List_node_base *p_Var19;
  element_type *peVar20;
  _Hash_node_base *p_Var21;
  byte bVar22;
  ptr<raft_params> clone;
  undefined1 local_c8 [16];
  ptr<peer> pp;
  undefined1 local_a8 [16];
  ptr<srv_config> s_config;
  ptr<raft_params> params;
  ptr<peer> local_70;
  undefined8 local_60;
  undefined **local_58;
  element_type *local_50;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  ptr<cluster_config> c_config;
  
  bVar22 = 0;
  context::get_params((context *)&params);
  get_config((raft_server *)&c_config);
  p_Var21 = (this->peers_)._M_h._M_before_begin._M_nxt;
  if (p_Var21 != (_Hash_node_base *)0x0) {
    do {
      pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)p_Var21[2]._M_nxt;
      pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var21[3]._M_nxt;
      if (pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_use_count = (pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_use_count = (pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      bVar9 = is_regular_member(this,&pp);
      if (bVar9) {
        p_Var19 = (_List_node_base *)
                  &(c_config.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->servers_;
        do {
          p_Var19 = (((_List_base<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
                       *)&p_Var19->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
          if (p_Var19 ==
              (_List_node_base *)
              &(c_config.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->servers_) {
            s_config.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)0x0;
            s_config.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            goto LAB_001dd6ab;
          }
          s_config.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)p_Var19[1]._M_next;
        } while ((s_config.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                 )->id_ != (((pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                             )->config_).
                            super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr)->id_);
        s_config.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var19[1]._M_prev;
        if (s_config.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
LAB_001dd530:
          if (((this->hb_alive_)._M_base._M_i & 1U) == 0) {
            bVar9 = peer::need_to_reconnect
                              (pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr);
            uVar13 = timer_helper::get_us
                               (&(pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr)->last_active_timer_);
            if ((int)(uVar13 / 1000) <=
                DAT_005e09d0 *
                (params.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                ->heart_beat_interval_) {
              if (!bVar9) goto LAB_001dd6ab;
              goto LAB_001dd53e;
            }
            peVar5 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            if (peVar5 != (element_type *)0x0) {
              iVar10 = (*peVar5->_vptr_logger[7])();
              if (2 < iVar10) {
                peVar5 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr;
                msg_if_given_abi_cxx11_
                          ((string *)&clone,
                           "connection to peer %d is not active long time: %d ms, need reconnection for prevote"
                           ,(ulong)(uint)(((pp.
                                            super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr)->config_).
                                          super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->id_,uVar13 / 1000 & 0xffffffff);
                (*peVar5->_vptr_logger[8])
                          (peVar5,3,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_vote.cxx"
                           ,"request_prevote",0x49,&clone);
                if (clone.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                    != (element_type *)local_c8) {
                  operator_delete(clone.
                                  super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr);
                }
              }
              goto LAB_001dd53e;
            }
          }
          else {
LAB_001dd53e:
            peVar5 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            if ((peVar5 != (element_type *)0x0) &&
               (iVar10 = (*peVar5->_vptr_logger[7])(), 3 < iVar10)) {
              peVar5 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr;
              msg_if_given_abi_cxx11_
                        ((string *)&clone,"reset RPC client for peer %d",
                         (ulong)(uint)(s_config.
                                       super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr)->id_);
              (*peVar5->_vptr_logger[8])
                        (peVar5,4,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_vote.cxx"
                         ,"request_prevote",0x4f,&clone);
              if (clone.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                  != (element_type *)local_c8) {
                operator_delete(clone.
                                super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr);
              }
            }
          }
          peer::recreate_rpc(pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                             &s_config,
                             (this->ctx_)._M_t.
                             super___uniq_ptr_impl<nuraft::context,_std::default_delete<nuraft::context>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_nuraft::context_*,_std::default_delete<nuraft::context>_>
                             .super__Head_base<0UL,_nuraft::context_*,_false>._M_head_impl);
        }
        else {
          if (__libc_single_threaded != '\0') {
            (s_config.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi)->_M_use_count =
                 (s_config.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            goto LAB_001dd530;
          }
          LOCK();
          (s_config.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (s_config.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
          if (s_config.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (element_type *)0x0) goto LAB_001dd530;
        }
LAB_001dd6ab:
        if (s_config.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (s_config.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
      }
      if (pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                  );
      }
      p_Var21 = p_Var21->_M_nxt;
    } while (p_Var21 != (_Hash_node_base *)0x0);
  }
  iVar11 = get_quorum_for_election(this);
  iVar10 = (this->pre_vote_).live_.super___atomic_base<int>._M_i;
  iVar12 = (this->pre_vote_).dead_.super___atomic_base<int>._M_i;
  iVar17 = iVar12 + iVar10;
  if (iVar17 != 0 && SCARRY4(iVar12,iVar10) == iVar17 < 0) {
    if (iVar11 < (this->pre_vote_).dead_.super___atomic_base<int>._M_i +
                 (this->pre_vote_).live_.super___atomic_base<int>._M_i) {
      LOCK();
      (this->pre_vote_).failure_count_.super___atomic_base<int>._M_i = 0;
      UNLOCK();
    }
    else {
      LOCK();
      paVar1 = &(this->pre_vote_).failure_count_;
      (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
      UNLOCK();
      peVar5 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if ((peVar5 != (element_type *)0x0) && (iVar10 = (*peVar5->_vptr_logger[7])(), 2 < iVar10)) {
        peVar5 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        msg_if_given_abi_cxx11_
                  ((string *)&clone,
                   "total %d nodes (including this node) responded for pre-vote (term %lu, live %d, dead %d), at least %d nodes should respond. failure count %d"
                   ,(ulong)(uint)((this->pre_vote_).dead_.super___atomic_base<int>._M_i +
                                 (this->pre_vote_).live_.super___atomic_base<int>._M_i),
                   (this->pre_vote_).term_,
                   (ulong)(uint)(this->pre_vote_).live_.super___atomic_base<int>._M_i,
                   (ulong)(uint)(this->pre_vote_).dead_.super___atomic_base<int>._M_i,
                   (ulong)(iVar11 + 1),
                   (ulong)(uint)(this->pre_vote_).failure_count_.super___atomic_base<int>._M_i);
        (*peVar5->_vptr_logger[8])
                  (peVar5,3,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_vote.cxx"
                   ,"request_prevote",0x62,&clone);
        if (clone.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)local_c8) {
          operator_delete(clone.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr);
        }
      }
    }
  }
  iVar11 = get_num_voting_members(this);
  if (((iVar11 == 2) &&
      ((params.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
       auto_adjust_quorum_for_small_cluster_ != false)) &&
     (DAT_005e09d8 < (this->pre_vote_).failure_count_.super___atomic_base<int>._M_i)) {
    peVar5 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar5 != (element_type *)0x0) && (iVar10 = (*peVar5->_vptr_logger[7])(), 2 < iVar10)) {
      peVar5 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_
                ((string *)&clone,
                 "2-node cluster\'s pre-vote is failing long time, adjust quorum to 1");
      (*peVar5->_vptr_logger[8])
                (peVar5,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_vote.cxx"
                 ,"request_prevote",0x6d,&clone);
      if (clone.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)local_c8) {
        operator_delete(clone.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr);
      }
    }
    clone.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x78);
    (clone.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
    _M_use_count = 1;
    (clone.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
    _M_weak_count = 1;
    (clone.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
    _vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_005c2ac0;
    clone.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         (clone.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi + 1);
    peVar20 = clone.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    for (lVar18 = 0x1a; lVar18 != 0; lVar18 = lVar18 + -1) {
      peVar20->election_timeout_upper_bound_ =
           (params.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           election_timeout_upper_bound_;
      params.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           ((long)params.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           + (ulong)bVar22 * -8 + 4);
      peVar20 = (element_type *)((long)peVar20 + (ulong)bVar22 * -8 + 4);
    }
    clone.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[4].
    _M_use_count = 1;
    clone.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[4].
    _M_weak_count = 1;
    context::set_params((this->ctx_)._M_t.
                        super___uniq_ptr_impl<nuraft::context,_std::default_delete<nuraft::context>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_nuraft::context_*,_std::default_delete<nuraft::context>_>
                        .super__Head_base<0UL,_nuraft::context_*,_false>._M_head_impl,&clone);
    if (clone.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (clone.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
  }
  LOCK();
  (this->hb_alive_)._M_base._M_i = false;
  UNLOCK();
  LOCK();
  (this->leader_).super___atomic_base<int>._M_i = -1;
  UNLOCK();
  LOCK();
  (this->role_)._M_i = candidate;
  UNLOCK();
  (this->pre_vote_).term_ =
       (((this->state_).super___shared_ptr<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
       term_).super___atomic_base<unsigned_long>._M_i;
  LOCK();
  (this->pre_vote_).done_._M_base._M_i = false;
  UNLOCK();
  LOCK();
  (this->pre_vote_).abandoned_.super___atomic_base<int>._M_i = 0;
  UNLOCK();
  LOCK();
  (this->pre_vote_).dead_.super___atomic_base<int>._M_i = 0;
  UNLOCK();
  LOCK();
  (this->pre_vote_).live_.super___atomic_base<int>._M_i = 0;
  UNLOCK();
  LOCK();
  paVar1 = &(this->pre_vote_).dead_;
  (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
  UNLOCK();
  if (this->my_priority_ < this->target_priority_) {
    bVar9 = check_cond_for_zp_election(this);
    peVar5 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (!bVar9) {
      if ((peVar5 != (element_type *)0x0) && (iVar10 = (*peVar5->_vptr_logger[7])(), 3 < iVar10)) {
        peVar5 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        msg_if_given_abi_cxx11_
                  ((string *)&clone,
                   "[PRIORITY] will not initiate pre-vote due to priority: target %d, mine %d",
                   (ulong)(uint)this->target_priority_,(ulong)(uint)this->my_priority_);
        (*peVar5->_vptr_logger[8])
                  (peVar5,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_vote.cxx"
                   ,"request_prevote",0x80,&clone);
        if (clone.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)local_c8) {
          operator_delete(clone.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr);
        }
      }
      restart_election_timer(this);
      goto LAB_001dde21;
    }
    if ((peVar5 != (element_type *)0x0) && (iVar10 = (*peVar5->_vptr_logger[7])(), 3 < iVar10)) {
      peVar5 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_
                ((string *)&clone,"[PRIORITY] temporarily allow election for zero-priority member");
      (*peVar5->_vptr_logger[8])
                (peVar5,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_vote.cxx"
                 ,"request_prevote",0x7d,&clone);
      if (clone.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)local_c8) {
        operator_delete(clone.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr);
      }
    }
  }
  peVar5 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if ((peVar5 != (element_type *)0x0) && (iVar10 = (*peVar5->_vptr_logger[7])(), 3 < iVar10)) {
    peVar5 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    uVar2 = this->id_;
    sVar3 = (this->role_)._M_i;
    pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_a8;
    if (sVar3 == leader) {
      puVar14 = local_a8 + 6;
      local_a8._0_6_ = 0x726500000000;
      local_a8._0_4_ = 0x6461656c;
      pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x6;
    }
    else if (sVar3 == candidate) {
      puVar14 = local_a8 + 9;
      local_a8._0_8_ = (element_type *)0x74616469646e6163;
      local_a8[8] = 0x65;
      pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x9;
    }
    else if (sVar3 == follower) {
      puVar14 = local_a8 + 8;
      local_a8._0_8_ = (element_type *)0x7265776f6c6c6f66;
      pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x8;
    }
    else {
      puVar14 = local_a8 + 7;
      local_a8._0_7_ = 0x4e574f4e000000;
      local_a8._0_4_ = 0x4e4b4e55;
      pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x7;
    }
    *puVar14 = 0;
    _Var6 = (((this->state_).super___shared_ptr<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->term_).super___atomic_base<unsigned_long>._M_i;
    iVar10 = (*((this->log_store_).super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr)->_vptr_log_store[2])();
    iVar12 = (*((this->log_store_).super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr)->_vptr_log_store[2])();
    uVar15 = term_for_log(this,CONCAT44(extraout_var_00,iVar12) - 1);
    msg_if_given_abi_cxx11_
              ((string *)&clone,
               "[PRE-VOTE INIT] my id %d, my role %s, term %lu, log idx %lu, log term %lu, priority (target %d / mine %d)\n"
               ,(ulong)uVar2,local_a8,_Var6,CONCAT44(extraout_var,iVar10) + -1,uVar15,
               (ulong)(uint)this->target_priority_,(ulong)(uint)this->my_priority_);
    (*peVar5->_vptr_logger[8])
              (peVar5,4,
               "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_vote.cxx"
               ,"request_prevote",0x8b,&clone);
    if (clone.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)local_c8) {
      operator_delete(clone.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr);
    }
    if (pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)local_a8) {
      operator_delete(pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
  }
  p_Var21 = (this->peers_)._M_h._M_before_begin._M_nxt;
  if (p_Var21 != (_Hash_node_base *)0x0) {
    local_60 = &this->resp_handler_;
    local_50 = (element_type *)&PTR___Sp_counted_ptr_inplace_005c44f0;
    local_58 = &PTR__req_msg_005c4540;
    do {
      pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)p_Var21[2]._M_nxt;
      pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var21[3]._M_nxt;
      if (pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_use_count = (pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_use_count = (pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      bVar9 = is_regular_member(this,&pp);
      if (bVar9) {
        local_48._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             (((this->state_).super___shared_ptr<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->term_).super___atomic_base<unsigned_long>._M_i;
        iVar11 = (((pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->config_
                  ).super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->id_;
        iVar10 = (*((this->log_store_).
                    super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                   _vptr_log_store[2])();
        pp_Var16 = (_func_int **)term_for_log(this,CONCAT44(extraout_var_01,iVar10) - 1);
        iVar10 = (*((this->log_store_).
                    super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                   _vptr_log_store[2])();
        pp_Var7 = (_func_int **)(this->quick_commit_index_).super___atomic_base<unsigned_long>._M_i;
        s_config.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x60);
        (s_config.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count = 1;
        (s_config.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_weak_count = 1;
        (s_config.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_vptr__Sp_counted_base = (_func_int **)local_50;
        s_config.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)
             (s_config.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi + 1);
        iVar4 = this->id_;
        *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
         &s_config.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi[1]._M_use_count = local_48._M_pi;
        *(undefined4 *)
         &s_config.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi[2]._vptr__Sp_counted_base = 0x14;
        *(int32 *)((long)&s_config.
                          super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi[2]._vptr__Sp_counted_base + 4) = iVar4;
        s_config.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi[2]._M_use_count = iVar11;
        s_config.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi[1]._vptr__Sp_counted_base = (_func_int **)local_58;
        s_config.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi[3]._vptr__Sp_counted_base = pp_Var16;
        *(long *)&s_config.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi[3]._M_use_count = CONCAT44(extraout_var_02,iVar10) + -1;
        s_config.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi[4]._vptr__Sp_counted_base = pp_Var7;
        s_config.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi[4]._M_use_count = 0;
        s_config.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi[4]._M_weak_count = 0;
        s_config.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi[5]._vptr__Sp_counted_base = (_func_int **)0x0;
        s_config.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi[5]._M_use_count = 0;
        s_config.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi[5]._M_weak_count = 0;
        LOCK();
        bVar9 = ((pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                busy_flag_)._M_base._M_i == false;
        if (bVar9) {
          ((pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->busy_flag_).
          _M_base._M_i = true;
        }
        UNLOCK();
        if (bVar9) {
          local_70.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_70.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
          if (pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
              _M_use_count = (pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
              _M_use_count = (pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi)->_M_use_count + 1;
            }
          }
          peer::send_req(pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                         &local_70,(ptr<req_msg> *)&s_config,(rpc_handler *)local_60);
          if (local_70.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_70.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
        }
        else {
          peVar5 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          if ((peVar5 != (element_type *)0x0) && (iVar10 = (*peVar5->_vptr_logger[7])(), 2 < iVar10)
             ) {
            peVar5 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            peVar8 = ((pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                     config_).super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            msg_if_given_abi_cxx11_
                      ((string *)&clone,"failed to send prevote request: peer %d (%s) is busy",
                       (ulong)(uint)peVar8->id_,(peVar8->endpoint_)._M_dataplus._M_p);
            (*peVar5->_vptr_logger[8])
                      (peVar5,3,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_vote.cxx"
                       ,"request_prevote",0xa0,&clone);
            if (clone.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                (element_type *)local_c8) {
              operator_delete(clone.
                              super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr);
            }
          }
        }
        if (s_config.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (s_config.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
      }
      if (pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                  );
      }
      p_Var21 = p_Var21->_M_nxt;
    } while (p_Var21 != (_Hash_node_base *)0x0);
  }
LAB_001dde21:
  if (c_config.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (c_config.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (params.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (params.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return;
}

Assistant:

void raft_server::request_prevote() {
    ptr<raft_params> params = ctx_->get_params();
    ptr<cluster_config> c_config = get_config();
    for (peer_itor it = peers_.begin(); it != peers_.end(); ++it) {
        ptr<peer> pp = it->second;
        if (!is_regular_member(pp)) continue;
        ptr<srv_config> s_config = c_config->get_server( pp->get_id() );

        if (s_config) {
            bool recreate = false;
            if (hb_alive_) {
                // First pre-vote request: reset RPC client for all peers.
                recreate = true;

            } else {
                // Since second time: reset only if `rpc_` is null.
                recreate = pp->need_to_reconnect();

                // Or if it is not active long time, reconnect as well.
                int32 last_active_time_ms = pp->get_active_timer_us() / 1000;
                if ( last_active_time_ms >
                         params->heart_beat_interval_ *
                             raft_server::raft_limits_.reconnect_limit_ ) {
                    p_wn( "connection to peer %d is not active long time: %d ms, "
                          "need reconnection for prevote",
                          pp->get_id(),
                          last_active_time_ms );
                    recreate = true;
                }
            }

            if (recreate) {
                p_in("reset RPC client for peer %d", s_config->get_id());
                pp->recreate_rpc(s_config, *ctx_);
            }
        }
    }

    int quorum_size = get_quorum_for_election();
    if (pre_vote_.live_ + pre_vote_.dead_ > 0) {
        if (pre_vote_.live_ + pre_vote_.dead_ < quorum_size + 1) {
            // Pre-vote failed due to non-responding voters.
            pre_vote_.failure_count_++;
            p_wn("total %d nodes (including this node) responded for pre-vote "
                 "(term %" PRIu64 ", live %d, dead %d), at least %d nodes should "
                 "respond. failure count %d",
                 pre_vote_.live_.load() + pre_vote_.dead_.load(),
                 pre_vote_.term_,
                 pre_vote_.live_.load(),
                 pre_vote_.dead_.load(),
                 quorum_size + 1,
                 pre_vote_.failure_count_.load());
        } else {
            pre_vote_.failure_count_ = 0;
        }
    }
    int num_voting_members = get_num_voting_members();
    if ( params->auto_adjust_quorum_for_small_cluster_ &&
         num_voting_members == 2 &&
         pre_vote_.failure_count_ > raft_server::raft_limits_.vote_limit_ ) {
        // 2-node cluster's pre-vote failed due to offline node.
        p_wn("2-node cluster's pre-vote is failing long time, "
             "adjust quorum to 1");
        ptr<raft_params> clone = cs_new<raft_params>(*params);
        clone->custom_commit_quorum_size_ = 1;
        clone->custom_election_quorum_size_ = 1;
        ctx_->set_params(clone);
    }

    hb_alive_ = false;
    leader_ = -1;
    role_ = srv_role::candidate;
    pre_vote_.reset(state_->get_term());
    // Count for myself.
    pre_vote_.dead_++;

    if ( my_priority_ < target_priority_ ) {
        if ( check_cond_for_zp_election() ) {
            p_in("[PRIORITY] temporarily allow election for zero-priority member");
        } else {
            p_in("[PRIORITY] will not initiate pre-vote due to priority: "
                 "target %d, mine %d", target_priority_, my_priority_);
            restart_election_timer();
            return;
        }
    }

    p_in("[PRE-VOTE INIT] my id %d, my role %s, term %" PRIu64 ", log idx %" PRIu64 ", "
         "log term %" PRIu64 ", priority (target %d / mine %d)\n",
         id_, srv_role_to_string(role_).c_str(),
         state_->get_term(), log_store_->next_slot() - 1,
         term_for_log(log_store_->next_slot() - 1),
         target_priority_, my_priority_);

    for (peer_itor it = peers_.begin(); it != peers_.end(); ++it) {
        ptr<peer> pp = it->second;
        if (!is_regular_member(pp)) {
            // Do not send voting request to learner.
            continue;
        }

        ptr<req_msg> req( cs_new<req_msg>
                          ( state_->get_term(),
                            msg_type::pre_vote_request,
                            id_,
                            pp->get_id(),
                            term_for_log(log_store_->next_slot() - 1),
                            log_store_->next_slot() - 1,
                            quick_commit_index_.load() ) );
        if (pp->make_busy()) {
            pp->send_req(pp, req, resp_handler_);
        } else {
            p_wn("failed to send prevote request: peer %d (%s) is busy",
                 pp->get_id(), pp->get_endpoint().c_str());
        }
    }
}